

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O2

_Bool normalize_overflow(int *tensptr,int *unitsptr,int base)

{
  uint uVar1;
  _Bool _Var2;
  uint j;
  
  uVar1 = *unitsptr;
  if ((int)uVar1 < 0) {
    j = ~(~uVar1 / (uint)base);
  }
  else {
    j = uVar1 / (uint)base;
  }
  *unitsptr = uVar1 - base * j;
  _Var2 = _PDCLIB_increment_overflow(tensptr,j);
  return _Var2;
}

Assistant:

static bool normalize_overflow( int * tensptr, int * unitsptr, int base )
{
    int tensdelta;

    tensdelta = ( *unitsptr >= 0 ) ?
        ( *unitsptr / base ) :
        ( -1 - ( -1 - *unitsptr ) / base );
    *unitsptr -= tensdelta * base;
    return _PDCLIB_increment_overflow( tensptr, tensdelta );
}